

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int FindMsgSeanet(uchar *buf,int buflen,uchar **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  int *pFoundMsgTmpLen_local;
  uchar **pFoundMsg_local;
  int buflen_local;
  uchar *buf_local;
  
  *pFoundMsg = buf;
  *pFoundMsgTmpLen = buflen;
  do {
    iVar1 = AnalyseBufSeanet(*pFoundMsg,*pFoundMsgTmpLen);
    if (iVar1 == 0) {
      return 0;
    }
    *pFoundMsg = *pFoundMsg + 1;
    *pFoundMsgTmpLen = *pFoundMsgTmpLen + -1;
  } while (10 < *pFoundMsgTmpLen);
  *pFoundMsg = (uchar *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindMsgSeanet(unsigned char* buf, int buflen, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	*pFoundMsg = buf;
	*pFoundMsgTmpLen = buflen;

	while (AnalyseBufSeanet(*pFoundMsg, *pFoundMsgTmpLen) != EXIT_SUCCESS)
	{
		(*pFoundMsg)++;
		(*pFoundMsgTmpLen)--;
		if (*pFoundMsgTmpLen < MIN_MESSAGE_LEN_SEANET)
		{
			*pFoundMsg = NULL;
			*pFoundMsgTmpLen = 0;
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}